

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86_fma.cpp
# Opt level: O2

void ncnn::get_optimal_tile_mnk
               (int M,int N,int K,int constant_TILE_M,int constant_TILE_N,int constant_TILE_K,
               int *TILE_M,int *TILE_N,int *TILE_K,int nT)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  uint uVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  float fVar7;
  
  uVar3 = get_cpu_level2_cache_size();
  if (nT == 0) {
    nT = get_physical_big_cpu_count();
  }
  if ((long)(int)uVar3 < 0) {
    fVar7 = (float)((ulong)(uVar3 & 1) | (ulong)(long)(int)uVar3 >> 1);
    fVar7 = fVar7 + fVar7;
  }
  else {
    fVar7 = (float)(int)uVar3;
  }
  auVar2 = vsqrtss_avx(ZEXT416((uint)(fVar7 * 0.083333336)),ZEXT416((uint)(fVar7 * 0.083333336)));
  uVar3 = ((int)auVar2._0_4_ / 8) * 8;
  if ((int)uVar3 < 9) {
    uVar3 = 8;
  }
  *TILE_M = uVar3;
  iVar4 = ((int)auVar2._0_4_ / 4) * 4;
  if (iVar4 < 5) {
    iVar4 = 4;
  }
  *TILE_N = iVar4;
  *TILE_K = uVar3;
  if (0 < K) {
    uVar1 = (ulong)((K + uVar3) - 1) / (ulong)uVar3;
    iVar4 = (int)uVar1;
    uVar5 = (int)(((K + iVar4) - 1) / uVar1) + 7U & 0xfffffff8;
    if (uVar3 <= uVar5) {
      uVar5 = uVar3;
    }
    *TILE_K = uVar5;
    if (iVar4 == 1) {
      iVar4 = (int)((fVar7 * 0.125) / (float)(int)uVar5);
      uVar3 = (iVar4 / 8) * 8;
      if ((int)uVar3 < 9) {
        uVar3 = 8;
      }
      *TILE_M = uVar3;
      iVar4 = (iVar4 / 4) * 4;
      if (iVar4 < 5) {
        iVar4 = 4;
      }
      *TILE_N = iVar4;
    }
  }
  iVar4 = get_physical_cpu_count();
  if (nT <= iVar4) {
    iVar4 = nT;
  }
  iVar4 = iVar4 * *TILE_M;
  iVar6 = iVar4;
  if ((0 < M) &&
     (iVar6 = (iVar4 + M + -1) / iVar4, iVar6 = (((iVar6 + M + -1) / iVar6 + 7) / 8) * 8,
     iVar4 <= iVar6)) {
    iVar6 = iVar4;
  }
  *TILE_M = iVar6;
  if (0 < N) {
    iVar4 = *TILE_N;
    iVar6 = (N + iVar4 + -1) / iVar4;
    iVar6 = (((N + iVar6 + -1) / iVar6 + 3) / 4) * 4;
    if (iVar4 <= iVar6) {
      iVar6 = iVar4;
    }
    *TILE_N = iVar6;
  }
  if (1 < nT) {
    uVar3 = *TILE_M;
    iVar4 = 1;
    if (1 < (int)uVar3 / nT) {
      iVar4 = (int)uVar3 / nT;
    }
    uVar5 = iVar4 + 7U & 0x7ffffff8;
    if ((int)uVar3 <= (int)uVar5) {
      uVar5 = uVar3;
    }
    *TILE_M = uVar5;
  }
  if (0 < constant_TILE_M) {
    *TILE_M = constant_TILE_M + 7U & 0x7ffffff8;
  }
  if (0 < constant_TILE_N) {
    *TILE_N = constant_TILE_N + 3U & 0x7ffffffc;
  }
  if (0 < constant_TILE_K) {
    *TILE_K = constant_TILE_K + 7U & 0x7ffffff8;
  }
  return;
}

Assistant:

static void get_optimal_tile_mnk(int M, int N, int K, int constant_TILE_M, int constant_TILE_N, int constant_TILE_K, int& TILE_M, int& TILE_N, int& TILE_K, int nT)
{
    // resolve optimal tile size from cache size
    const size_t l2_cache_size = get_cpu_level2_cache_size();

    if (nT == 0)
        nT = get_physical_big_cpu_count();

    int tile_size = (int)sqrt((float)l2_cache_size / 3 / sizeof(float));

#if __AVX512F__
    TILE_M = std::max(16, tile_size / 16 * 16);
    TILE_N = std::max(4, tile_size / 4 * 4);
    TILE_K = std::max(16, tile_size / 16 * 16);
#elif __AVX__
    TILE_M = std::max(8, tile_size / 8 * 8);
    TILE_N = std::max(4, tile_size / 4 * 4);
    TILE_K = std::max(8, tile_size / 8 * 8);
#elif __SSE2__
    TILE_M = std::max(4, tile_size / 4 * 4);
    TILE_N = std::max(4, tile_size / 4 * 4);
    TILE_K = std::max(4, tile_size / 4 * 4);
#else
    TILE_M = std::max(2, tile_size / 2 * 2);
    TILE_N = std::max(1, tile_size);
    TILE_K = std::max(2, tile_size / 2 * 2);
#endif

    if (K > 0)
    {
        int nn_K = (K + TILE_K - 1) / TILE_K;
#if __AVX512F__
        TILE_K = std::min(TILE_K, ((K + nn_K - 1) / nn_K + 15) / 16 * 16);
#elif __AVX__
        TILE_K = std::min(TILE_K, ((K + nn_K - 1) / nn_K + 7) / 8 * 8);
#elif __SSE2__
        TILE_K = std::min(TILE_K, ((K + nn_K - 1) / nn_K + 3) / 4 * 4);
#else
        TILE_K = std::min(TILE_K, ((K + nn_K - 1) / nn_K + 1) / 2 * 2);
#endif

        if (nn_K == 1)
        {
            tile_size = (int)((float)l2_cache_size / 2 / sizeof(float) / TILE_K);

#if __AVX512F__
            TILE_M = std::max(16, tile_size / 16 * 16);
            TILE_N = std::max(4, tile_size / 4 * 4);
#elif __AVX__
            TILE_M = std::max(8, tile_size / 8 * 8);
            TILE_N = std::max(4, tile_size / 4 * 4);
#elif __SSE2__
            TILE_M = std::max(4, tile_size / 4 * 4);
            TILE_N = std::max(4, tile_size / 4 * 4);
#else
            TILE_M = std::max(2, tile_size / 2 * 2);
            TILE_N = std::max(1, tile_size);
#endif
        }
    }

    TILE_M *= std::min(nT, get_physical_cpu_count());

    if (M > 0)
    {
        int nn_M = (M + TILE_M - 1) / TILE_M;
#if __AVX512F__
        TILE_M = std::min(TILE_M, ((M + nn_M - 1) / nn_M + 15) / 16 * 16);
#elif __AVX__
        TILE_M = std::min(TILE_M, ((M + nn_M - 1) / nn_M + 7) / 8 * 8);
#elif __SSE2__
        TILE_M = std::min(TILE_M, ((M + nn_M - 1) / nn_M + 3) / 4 * 4);
#else
        TILE_M = std::min(TILE_M, ((M + nn_M - 1) / nn_M + 1) / 2 * 2);
#endif
    }

    if (N > 0)
    {
        int nn_N = (N + TILE_N - 1) / TILE_N;
#if __AVX512F__
        TILE_N = std::min(TILE_N, ((N + nn_N - 1) / nn_N + 3) / 4 * 4);
#elif __AVX__
        TILE_N = std::min(TILE_N, ((N + nn_N - 1) / nn_N + 3) / 4 * 4);
#elif __SSE2__
        TILE_N = std::min(TILE_N, ((N + nn_N - 1) / nn_N + 3) / 4 * 4);
#else
        TILE_N = std::min(TILE_N, (N + nn_N - 1) / nn_N);
#endif
    }

    if (nT > 1)
    {
#if __AVX512F__
        TILE_M = std::min(TILE_M, (std::max(1, TILE_M / nT) + 15) / 16 * 16);
#elif __AVX__
        TILE_M = std::min(TILE_M, (std::max(1, TILE_M / nT) + 7) / 8 * 8);
#elif __SSE2__
        TILE_M = std::min(TILE_M, (std::max(1, TILE_M / nT) + 3) / 4 * 4);
#else
        TILE_M = std::min(TILE_M, (std::max(1, TILE_M / nT) + 1) / 2 * 2);
#endif
    }

    // always take constant TILE_M/N/K value when provided
    if (constant_TILE_M > 0)
    {
#if __AVX512F__
        TILE_M = (constant_TILE_M + 15) / 16 * 16;
#elif __AVX__
        TILE_M = (constant_TILE_M + 7) / 8 * 8;
#elif __SSE2__
        TILE_M = (constant_TILE_M + 3) / 4 * 4;
#else
        TILE_M = (constant_TILE_M + 1) / 2 * 2;
#endif
    }

    if (constant_TILE_N > 0)
    {
#if __AVX512F__
        TILE_N = (constant_TILE_N + 3) / 4 * 4;
#elif __AVX__
        TILE_N = (constant_TILE_N + 3) / 4 * 4;
#elif __SSE2__
        TILE_N = (constant_TILE_N + 3) / 4 * 4;
#else
        TILE_N = constant_TILE_N;
#endif
    }

    if (constant_TILE_K > 0)
    {
#if __AVX512F__
        TILE_K = (constant_TILE_K + 15) / 16 * 16;
#elif __AVX__
        TILE_K = (constant_TILE_K + 7) / 8 * 8;
#elif __SSE2__
        TILE_K = (constant_TILE_K + 3) / 4 * 4;
#else
        TILE_K = (constant_TILE_K + 1) / 2 * 2;
#endif
    }
}